

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

ModulePtr __thiscall
chaiscript::bootstrap::bootstrap_pod_type<char>(bootstrap *this,string *name,ModulePtr *m)

{
  element_type *peVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ModulePtr MVar5;
  ModulePtr local_e8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  bootstrap local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Type_Info local_48;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + name->_M_string_length);
  local_48.m_type_info = (type_info *)&char::typeinfo;
  local_48.m_bare_type_info = (type_info *)&char::typeinfo;
  local_48.m_flags = 0x10;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)peVar1,&local_48,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  chaiscript::dispatch::detail::build_constructor_<char>((_func_char *)&local_c8);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + name->_M_string_length);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_c8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  construct_pod<char>(local_58,name,&local_e8);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<char,std::__cxx11::string_const&>((chaiscript *)&local_d8,parse_string<char>);
  std::operator+(&local_98,"to_",name);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_d8,&local_98);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_d8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr bootstrap_pod_type(const std::string &name, ModulePtr m = std::make_shared<Module>())
    {
      m->add(user_type<T>(), name);
      m->add(constructor<T()>(), name);
      construct_pod<T>(name, m);

      m->add(fun(&parse_string<T>), "to_" + name);
      return m;
    }